

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubVarSup.cpp
# Opt level: O0

Clause * __thiscall
Inferences::SubVarSup::performSubVarSup
          (SubVarSup *this,Clause *rwClause,Literal *rwLit,TermList rwTerm,Clause *eqClause,
          Literal *eqLit,TermList eqLHS,bool eqIsResult)

{
  TermList lhs;
  TermList arg2;
  TermList arg2_00;
  bool bVar1;
  int iVar2;
  uint i_00;
  uint uVar3;
  uint uVar4;
  int iVar5;
  Options *this_00;
  LiteralSelector *pLVar6;
  Literal **ppLVar7;
  Literal *pLVar8;
  Clause *this_01;
  undefined8 in_RCX;
  Literal *in_RDX;
  Clause *in_RSI;
  long *in_RDI;
  Clause *in_R8;
  Literal *in_R9;
  undefined8 in_stack_00000008;
  byte in_stack_00000010;
  Clause *res;
  Literal *currAfter_1;
  Literal *curr_1;
  uint i_1;
  Literal *currAfter;
  Literal *curr;
  uint i;
  RStack<Literal_*> resLits;
  Inference inf;
  bool afterCheck;
  Literal *tgtLitS;
  Ordering *ordering;
  TermList newTgtTm;
  TermList newEqLHS;
  TermList eqSort;
  TermList varSort;
  TermList tgtTerm;
  TermList freshVarS;
  TermList eqLHSS;
  Literal *eqLitS;
  TermList rwTermS;
  Literal *rwLitS;
  int newAge;
  uint eqLength;
  uint rwLength;
  TermList freshVar;
  undefined4 in_stack_fffffffffffffd58;
  uint in_stack_fffffffffffffd5c;
  RobSubstitution *in_stack_fffffffffffffd60;
  TermList in_stack_fffffffffffffd68;
  TermList in_stack_fffffffffffffd70;
  undefined7 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd7f;
  RobSubstitution *in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd9c;
  undefined1 shared;
  uint in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  TermList in_stack_fffffffffffffda8;
  TermList in_stack_fffffffffffffdb0;
  TermList in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc8;
  Inference *inf_00;
  undefined7 in_stack_fffffffffffffdd0;
  undefined1 in_stack_fffffffffffffdd7;
  byte bVar9;
  void *local_218;
  void *pvStack_210;
  SplitSet *local_208;
  void *pvStack_200;
  void *local_1f8;
  float fStack_1f0;
  float fStack_1ec;
  Clause *local_1e8;
  Literal *local_1e0;
  undefined8 in_stack_fffffffffffffe28;
  int index;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  TermList in_stack_fffffffffffffe38;
  uint local_1a4;
  undefined1 local_190 [32];
  void *pvStack_170;
  SplitSet *local_168;
  void *pvStack_160;
  void *local_158;
  float fStack_150;
  float fStack_14c;
  byte local_141;
  uint64_t local_140;
  uint64_t local_138;
  Literal *local_130;
  Ordering *local_128;
  uint64_t local_120;
  uint64_t local_118;
  uint64_t local_110;
  uint64_t local_108;
  uint64_t local_100;
  uint64_t local_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  uint64_t local_e0;
  uint64_t local_d8;
  uint64_t local_d0;
  uint64_t local_c8;
  uint64_t local_c0;
  uint64_t local_b8;
  undefined8 local_b0;
  uint64_t local_a8;
  undefined8 local_a0;
  uint64_t local_98;
  Literal *local_90;
  undefined8 local_88;
  uint64_t local_80;
  Literal *local_78;
  int local_6c;
  uint local_68;
  uint local_64;
  undefined8 local_60;
  byte local_41;
  Literal *local_40;
  Clause *local_38;
  Literal *local_30;
  Clause *local_28;
  undefined8 local_18;
  undefined8 local_10;
  Clause *local_8;
  
  shared = (undefined1)((uint)in_stack_fffffffffffffd9c >> 0x18);
  index = (int)((ulong)in_stack_fffffffffffffe28 >> 0x20);
  iVar5 = (int)((ulong)in_stack_fffffffffffffdc8 >> 0x20);
  local_18 = in_stack_00000008;
  local_41 = in_stack_00000010 & 1;
  local_40 = in_R9;
  local_38 = in_R8;
  local_30 = in_RDX;
  local_28 = in_RSI;
  local_10 = in_RCX;
  if ((performSubVarSup(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,bool)
       ::subst == '\0') &&
     (iVar2 = __cxa_guard_acquire(&performSubVarSup(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,bool)
                                   ::subst), iVar2 != 0)) {
    Kernel::RobSubstitution::RobSubstitution(in_stack_fffffffffffffd80);
    __cxa_atexit(Kernel::RobSubstitution::~RobSubstitution,&performSubVarSup::subst,&__dso_handle);
    __cxa_guard_release(&performSubVarSup(Kernel::Clause*,Kernel::Literal*,Kernel::TermList,Kernel::Clause*,Kernel::Literal*,Kernel::TermList,bool)
                         ::subst);
  }
  Kernel::RobSubstitution::reset(in_stack_fffffffffffffd60);
  i_00 = Kernel::Clause::maxVar((Clause *)in_stack_fffffffffffffd80);
  uVar3 = Kernel::Clause::maxVar((Clause *)in_stack_fffffffffffffd80);
  Lib::Int::max(i_00,uVar3);
  Kernel::TermList::TermList
            ((TermList *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
             SUB41((uint)in_stack_fffffffffffffd58 >> 0x18,0));
  local_64 = Kernel::Clause::length(local_28);
  local_68 = Kernel::Clause::length(local_38);
  uVar3 = Kernel::Clause::age((Clause *)0x82a3cc);
  uVar4 = Kernel::Clause::age((Clause *)0x82a3e0);
  local_6c = Lib::Int::max(uVar3,uVar4);
  local_6c = local_6c + 1;
  local_78 = Kernel::RobSubstitution::apply
                       ((RobSubstitution *)CONCAT44(uVar3,i_00),
                        (Literal *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                        iVar5);
  local_88 = local_10;
  local_80 = (uint64_t)
             Kernel::RobSubstitution::apply
                       ((RobSubstitution *)
                        CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                        in_stack_fffffffffffffe38,index);
  local_90 = Kernel::RobSubstitution::apply
                       ((RobSubstitution *)CONCAT44(uVar3,i_00),
                        (Literal *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                        iVar5);
  local_a0 = local_18;
  local_98 = (uint64_t)
             Kernel::RobSubstitution::apply
                       ((RobSubstitution *)
                        CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                        in_stack_fffffffffffffe38,index);
  local_b0 = local_60;
  local_a8 = (uint64_t)
             Kernel::RobSubstitution::apply
                       ((RobSubstitution *)
                        CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                        in_stack_fffffffffffffe38,index);
  local_c0 = local_98;
  lhs._content._4_4_ = in_stack_fffffffffffffd5c;
  lhs._content._0_4_ = in_stack_fffffffffffffd58;
  local_b8 = (uint64_t)Kernel::EqHelper::getOtherEqualitySide((Literal *)0x82a4e9,lhs);
  local_c8 = (uint64_t)
             Kernel::SortHelper::getEqualityArgumentSort
                       ((Literal *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
  local_e0 = (uint64_t)
             Kernel::SortHelper::getEqualityArgumentSort
                       ((Literal *)CONCAT17(in_stack_fffffffffffffd7f,in_stack_fffffffffffffd78));
  local_e8 = local_c8;
  local_f0 = local_a8;
  local_f8 = local_98;
  arg2._content._4_4_ = in_stack_fffffffffffffda4;
  arg2._content._0_4_ = in_stack_fffffffffffffda0;
  local_d0 = local_e0;
  local_d8 = (uint64_t)
             ApplicativeHelper::createAppTerm
                       (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                        in_stack_fffffffffffffda8,arg2,(bool)shared);
  local_108 = local_d0;
  local_110 = local_c8;
  local_118 = local_a8;
  local_120 = local_b8;
  arg2_00._content._4_4_ = in_stack_fffffffffffffda4;
  arg2_00._content._0_4_ = in_stack_fffffffffffffda0;
  local_100 = (uint64_t)
              ApplicativeHelper::createAppTerm
                        (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0,
                         in_stack_fffffffffffffda8,arg2_00,(bool)shared);
  local_128 = Saturation::SaturationAlgorithm::getOrdering((SaturationAlgorithm *)0x82a615);
  local_138 = local_80;
  local_140 = local_100;
  local_130 = Kernel::EqHelper::replace
                        ((Literal *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd70,
                         in_stack_fffffffffffffd68);
  bVar1 = Kernel::EqHelper::isEqTautology((Literal *)in_stack_fffffffffffffd60);
  if (bVar1) {
    local_8 = (Clause *)0x0;
  }
  else {
    this_00 = (Options *)(**(code **)(*in_RDI + 0x20))();
    bVar1 = Shell::Options::literalMaximalityAftercheck(this_00);
    bVar9 = 0;
    if (bVar1) {
      pLVar6 = Saturation::SaturationAlgorithm::getLiteralSelector((SaturationAlgorithm *)0x82a6e1);
      iVar5 = (*pLVar6->_vptr_LiteralSelector[2])();
      bVar9 = (byte)iVar5;
    }
    local_141 = bVar9 & 1;
    inf_00 = (Inference *)local_190;
    Kernel::GeneratingInference2::GeneratingInference2
              ((GeneratingInference2 *)inf_00,SUB_VAR_SUP,local_28,local_38);
    Kernel::Inference::Inference
              ((Inference *)in_stack_fffffffffffffd70._content,
               (GeneratingInference2 *)in_stack_fffffffffffffd68._content);
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
             )in_stack_fffffffffffffd60);
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                *)0x82a750);
    Lib::Stack<Kernel::Literal_*>::push
              ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffd60,
               (Literal *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
    for (local_1a4 = 0; local_1a4 < local_64; local_1a4 = local_1a4 + 1) {
      ppLVar7 = Kernel::Clause::operator[](local_28,local_1a4);
      if (*ppLVar7 != local_30) {
        Kernel::RobSubstitution::apply
                  ((RobSubstitution *)CONCAT44(uVar3,i_00),
                   (Literal *)CONCAT17(bVar9,in_stack_fffffffffffffdd0),(int)((ulong)inf_00 >> 0x20)
                  );
        pLVar8 = Kernel::EqHelper::replace
                           ((Literal *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd70,
                            in_stack_fffffffffffffd68);
        bVar1 = Kernel::EqHelper::isEqTautology((Literal *)in_stack_fffffffffffffd60);
        in_stack_fffffffffffffda4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffda4);
        if (bVar1) {
          local_8 = (Clause *)0x0;
          goto LAB_0082abd8;
        }
        if ((((local_141 & 1) != 0) &&
            (uVar4 = local_1a4, in_stack_fffffffffffffda0 = Kernel::Clause::numSelected(local_28),
            uVar4 < in_stack_fffffffffffffda0)) &&
           (iVar5 = (*local_128->_vptr_Ordering[2])(local_128,pLVar8,local_78), iVar5 == 1)) {
          *(int *)(DAT_01333840 + 0x1e8) = *(int *)(DAT_01333840 + 0x1e8) + 1;
          local_8 = (Clause *)0x0;
          goto LAB_0082abd8;
        }
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x82a95e);
        Lib::Stack<Kernel::Literal_*>::push
                  ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffd60,
                   (Literal *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      }
    }
    for (uVar4 = 0; uVar4 < local_68; uVar4 = uVar4 + 1) {
      ppLVar7 = Kernel::Clause::operator[](local_38,uVar4);
      if (*ppLVar7 != local_40) {
        local_1e0 = Kernel::RobSubstitution::apply
                              ((RobSubstitution *)CONCAT44(uVar3,i_00),
                               (Literal *)CONCAT17(bVar9,in_stack_fffffffffffffdd0),
                               (int)((ulong)inf_00 >> 0x20));
        bVar1 = Kernel::EqHelper::isEqTautology((Literal *)in_stack_fffffffffffffd60);
        if (bVar1) {
          local_8 = (Clause *)0x0;
          goto LAB_0082abd8;
        }
        Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
        operator->((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                    *)0x82aa66);
        Lib::Stack<Kernel::Literal_*>::push
                  ((Stack<Kernel::Literal_*> *)in_stack_fffffffffffffd60,
                   (Literal *)CONCAT44(in_stack_fffffffffffffd5c,in_stack_fffffffffffffd58));
      }
    }
    if (local_28 == local_38) {
      *(int *)(DAT_01333840 + 0xfc) = *(int *)(DAT_01333840 + 0xfc) + 1;
    }
    else if ((local_41 & 1) == 0) {
      *(int *)(DAT_01333840 + 0xf8) = *(int *)(DAT_01333840 + 0xf8) + 1;
    }
    else {
      *(int *)(DAT_01333840 + 0xf4) = *(int *)(DAT_01333840 + 0xf4) + 1;
    }
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    operator*((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)0x82ab18);
    local_1f8 = local_158;
    fStack_1f0 = fStack_150;
    fStack_1ec = fStack_14c;
    local_208 = local_168;
    pvStack_200 = pvStack_160;
    local_218 = (void *)local_190._24_8_;
    pvStack_210 = pvStack_170;
    this_01 = Kernel::Clause::fromStack
                        ((Stack<Kernel::Literal_*> *)CONCAT17(bVar9,in_stack_fffffffffffffdd0),
                         inf_00);
    Kernel::Inference::~Inference((Inference *)&local_218);
    local_1e8 = this_01;
    Kernel::Clause::setAge(this_01,in_stack_fffffffffffffd5c);
    local_8 = local_1e8;
LAB_0082abd8:
    Lib::Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
    ~Recycled((Recycled<Lib::Stack<Kernel::Literal_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
               *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
    Kernel::Inference::~Inference((Inference *)(local_190 + 0x18));
  }
  return local_8;
}

Assistant:

Clause* SubVarSup::performSubVarSup(
    Clause* rwClause, Literal* rwLit, TermList rwTerm,
    Clause* eqClause, Literal* eqLit, TermList eqLHS, bool eqIsResult)
{
  // we want the rwClause and eqClause to be active
  ASS(rwClause->store()==Clause::ACTIVE);
  ASS(eqClause->store()==Clause::ACTIVE);
  ASS(rwTerm.isVar());

  //cout << "performSubVarSup with " << rwClause->toString() << " and " << eqClause->toString() << endl;
  //cout << "rwTerm " << rwTerm.toString() << " eqLHSS " << eqLHS.toString() << endl;

  static RobSubstitution subst;
  subst.reset();
  
  TermList freshVar = TermList(Int::max(rwClause->maxVar(), eqClause->maxVar()) + 1, false);

  unsigned rwLength = rwClause->length();
  unsigned eqLength = eqClause->length();

  int newAge=Int::max(rwClause->age(),eqClause->age())+1; // TODO isn't this set automatically?

  Literal* rwLitS = subst.apply(rwLit, 0);
  TermList rwTermS = subst.apply(rwTerm, 0);
  Literal* eqLitS = subst.apply(eqLit, 1);
  TermList eqLHSS = subst.apply(eqLHS, 1);
  TermList freshVarS = subst.apply(freshVar, 0); 

  TermList tgtTerm = EqHelper::getOtherEqualitySide(eqLitS, eqLHSS);

  auto varSort = SortHelper::getEqualityArgumentSort(eqLitS);
  TermList eqSort = SortHelper::getEqualityArgumentSort(eqLitS);
  
  TermList newEqLHS = ApplicativeHelper::createAppTerm(eqSort, varSort, freshVarS, eqLHSS);
  TermList newTgtTm = ApplicativeHelper::createAppTerm(eqSort, varSort, freshVarS, tgtTerm);

  //ALWAYS(subst.unify(varSort, 0, varSort, 1));
  //ALWAYS(subst.unify(rwTerm, 0, newEqLHS, 1));

  Ordering& ordering = _salg->getOrdering();

  //Literal* rwLitS = subst.apply(rwLit, 0);
  //TermList rwTermS = subst.apply(rwTerm, 0);
  //newEqLHS = subst.apply(newEqLHS, 1);
  ///newTgtTm = subst.apply(newTgtTm, 1);

#if VDEBUG
   //ASS_EQ(rwTermS,newEqLHS);
#endif

  //cout << "Check ordering on " << tgtTermS.toString() << " and " << rwTermS.toString() << endl;

  /*if(rwLitS->isEquality()) {
    //check that we're not rewriting only the smaller side of an equality
    TermList arg0=*rwLitS->nthArgument(0);
    TermList arg1=*rwLitS->nthArgument(1);

    if(!arg0.containsSubterm(rwTermS)) {
      if(Ordering::isGreaterOrEqual(ordering.getEqualityArgumentOrder(rwLitS))) {
        return 0;
      }
    } else if(!arg1.containsSubterm(rwTermS)) {
      if(Ordering::isGreaterOrEqual(Ordering::reverse(ordering.getEqualityArgumentOrder(rwLitS)))) {
        return 0;
      }
    }
  }*/

  Literal* tgtLitS = EqHelper::replace(rwLitS,rwTermS,newTgtTm);

  //check we don't create an equational tautology (this happens during self-SubVarSup)
  if(EqHelper::isEqTautology(tgtLitS)) {
    return 0;
  }

  bool afterCheck = getOptions().literalMaximalityAftercheck() && _salg->getLiteralSelector().isBGComplete();

  Inference inf(GeneratingInference2(InferenceRule::SUB_VAR_SUP, rwClause, eqClause));
  RStack<Literal*> resLits;

  resLits->push(tgtLitS);
  for(unsigned i=0;i<rwLength;i++) {
    Literal* curr = (*rwClause)[i];
    if(curr!=rwLit) {
      Literal* currAfter = subst.apply(curr, 0);
      currAfter = EqHelper::replace(currAfter,rwTermS,newEqLHS);

      if(EqHelper::isEqTautology(currAfter)) {
        return nullptr;
      }
      
      if (afterCheck) {
        TIME_TRACE(TimeTrace::LITERAL_ORDER_AFTERCHECK);
        if (i < rwClause->numSelected() && ordering.compare(currAfter,rwLitS) == Ordering::GREATER) {
          env.statistics->inferencesBlockedForOrderingAftercheck++;
          return nullptr;
        }
      }

      resLits->push(currAfter);
    }
  }


  for(unsigned i=0;i<eqLength;i++) {
    Literal* curr=(*eqClause)[i];
    if(curr!=eqLit) {
      Literal* currAfter = subst.apply(curr, 1);

      if(EqHelper::isEqTautology(currAfter)) {
        return nullptr;
      }

      resLits->push(currAfter);
    }
  } //no need for after check as no variables in D are bound to anyhting
    //the most that is happenning is a rearrangement of vars in D
  

  
  if(rwClause==eqClause) {
    env.statistics->selfSubVarSup++;
  } else if(eqIsResult) {
    env.statistics->forwardSubVarSup++;
  } else {
    env.statistics->backwardSubVarSup++;
  }

  //cout << "SUBVARSUP " + res->toString() << endl;
  auto res = Clause::fromStack(*resLits, inf);
  res->setAge(newAge);
  return res;
}